

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingDistributions.cpp
# Opt level: O0

tuple<float,_float> getMoments(vector<float,_std::allocator<float>_> *results)

{
  bool bVar1;
  size_type sVar2;
  reference pfVar3;
  vector<float,_std::allocator<float>_> *in_RSI;
  double dVar4;
  tuple<float,_float> tVar5;
  float local_5c;
  float variance;
  float x;
  iterator __end1;
  iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  float sq_sum;
  float mean;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_28;
  float local_1c;
  float sum;
  vector<float,_std::allocator<float>_> *results_local;
  
  results_local = results;
  local_28._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(in_RSI);
  _sq_sum = std::vector<float,_std::allocator<float>_>::end(in_RSI);
  dVar4 = std::
          accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                    (local_28,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               )_sq_sum,0.0);
  local_1c = (float)dVar4;
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  local_5c = (float)sVar2;
  __range1._4_4_ = (float)dVar4 / local_5c;
  __range1._0_4_ = 0.0;
  __end1 = std::vector<float,_std::allocator<float>_>::begin(in_RSI);
  _variance = std::vector<float,_std::allocator<float>_>::end(in_RSI);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                     *)&variance), bVar1) {
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    __range1._0_4_ = (*pfVar3 - __range1._4_4_) * (*pfVar3 - __range1._4_4_) + __range1._0_4_;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end1);
  }
  std::vector<float,_std::allocator<float>_>::size(in_RSI);
  tVar5 = std::make_tuple<float&,float&>((float *)results,(float *)((long)&__range1 + 4));
  return (tuple<float,_float>)tVar5.super__Tuple_impl<0UL,_float,_float>;
}

Assistant:

std::tuple<float, float> getMoments (std::vector <float> results){
	float sum = std::accumulate(results.begin(), results.end(), 0.0);
	float mean = sum / results.size();

	float sq_sum = 0.0;
	for (float x: results){
		sq_sum += (x-mean)*(x-mean);
	}
	float variance = sq_sum / results.size();

	return std::make_tuple(mean, variance);
}